

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NC.hpp
# Opt level: O2

long __thiscall njoy::ENDFtk::section::Type<12>::Multiplicities::NC(Multiplicities *this)

{
  TabulationRecord *pTVar1;
  long lVar2;
  long lVar3;
  PartialMultiplicity *entry;
  TabulationRecord *this_00;
  
  if ((this->total_).
      super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>.
      _M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
      .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>._M_engaged
      == true) {
    lVar2 = TabulationRecord::NC((TabulationRecord *)this);
  }
  else {
    lVar2 = 0;
  }
  pTVar1 = &((this->partials_).
             super__Vector_base<njoy::ENDFtk::section::Type<12>::PartialMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<12>::PartialMultiplicity>_>
             ._M_impl.super__Vector_impl_data._M_finish)->super_TabulationRecord;
  for (this_00 = &((this->partials_).
                   super__Vector_base<njoy::ENDFtk::section::Type<12>::PartialMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<12>::PartialMultiplicity>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_TabulationRecord;
      this_00 != pTVar1; this_00 = this_00 + 1) {
    lVar3 = TabulationRecord::NC(this_00);
    lVar2 = lVar2 + lVar3;
  }
  return lVar2;
}

Assistant:

long NC() const {
  long NC = 0;
  if ( this->total_ ) { NC += this->total_->NC(); }
  for ( const auto& entry : this->partials_ ) {

    NC += entry.NC();
  }
  return NC;
}